

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O0

bool woff2::WriteFont(Font *font,size_t *offset,uint8_t *dst,size_t dst_size)

{
  uint16_t uVar1;
  bool bVar2;
  reference ppVar3;
  uint local_60;
  uint local_5c;
  pair<const_unsigned_int,_woff2::Font::Table> *i;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *__range1;
  uint16_t range_shift;
  uint16_t search_range;
  uint16_t max_pow2;
  size_t dst_size_local;
  uint8_t *dst_local;
  size_t *offset_local;
  Font *font_local;
  
  if (dst_size < (ulong)font->num_tables * 0x10 + 0xc) {
    font_local._7_1_ = false;
  }
  else {
    StoreU32(font->flavor,offset,dst);
    Store16((uint)font->num_tables,offset,dst);
    if (font->num_tables == 0) {
      local_5c = 0;
    }
    else {
      local_5c = Log2Floor((uint)font->num_tables);
    }
    if ((short)local_5c == 0) {
      local_60 = 0;
    }
    else {
      local_60 = 1 << ((char)local_5c + 4U & 0x1f);
    }
    uVar1 = font->num_tables;
    Store16(local_60 & 0xffff,offset,dst);
    Store16(local_5c & 0xffff,offset,dst);
    Store16((uint)(ushort)(uVar1 * 0x10 - (short)local_60),offset,dst);
    __end1 = std::
             map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
             ::begin(&font->tables);
    i = (pair<const_unsigned_int,_woff2::Font::Table> *)
        std::
        map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
        ::end(&font->tables);
    while (bVar2 = std::operator!=(&__end1,(_Self *)&i), bVar2) {
      ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::
               operator*(&__end1);
      bVar2 = WriteTable(&ppVar3->second,offset,dst,dst_size);
      if (!bVar2) {
        return false;
      }
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_woff2::Font::Table>_>::operator++
                (&__end1);
    }
    font_local._7_1_ = true;
  }
  return font_local._7_1_;
}

Assistant:

bool WriteFont(const Font& font, size_t* offset, uint8_t* dst,
               size_t dst_size) {
  if (dst_size < 12ULL + 16ULL * font.num_tables) {
    return FONT_COMPRESSION_FAILURE();
  }
  StoreU32(font.flavor, offset, dst);
  Store16(font.num_tables, offset, dst);
  uint16_t max_pow2 = font.num_tables ? Log2Floor(font.num_tables) : 0;
  uint16_t search_range = max_pow2 ? 1 << (max_pow2 + 4) : 0;
  uint16_t range_shift = (font.num_tables << 4) - search_range;
  Store16(search_range, offset, dst);
  Store16(max_pow2, offset, dst);
  Store16(range_shift, offset, dst);

  for (const auto& i : font.tables) {
    if (!WriteTable(i.second, offset, dst, dst_size)) {
      return false;
    }
  }

  return true;
}